

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitBreak
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Break *curr)

{
  Literal *this_00;
  int64_t iVar1;
  Flow *__return_storage_ptr___00;
  undefined1 local_c0 [8];
  Flow conditionFlow;
  Flow flow;
  
  conditionFlow.breakTo.super_IString.str._M_str = (char *)0x0;
  if (curr->value != (Expression *)0x0) {
    visit((Flow *)local_c0,this,curr->value);
    Flow::operator=((Flow *)&conditionFlow.breakTo.super_IString.str._M_str,(Flow *)local_c0);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_c0);
  }
  if (curr->condition == (Expression *)0x0) {
LAB_007a0730:
    Flow::Flow(__return_storage_ptr__,(Flow *)&conditionFlow.breakTo.super_IString.str._M_str);
  }
  else {
    __return_storage_ptr___00 = (Flow *)local_c0;
    visit(__return_storage_ptr___00,this,curr->condition);
    if (conditionFlow.breakTo.super_IString.str._M_len == 0) {
      this_00 = Flow::getSingleValue((Flow *)local_c0);
      iVar1 = Literal::getInteger(this_00);
      if (iVar1 != 0) {
        SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_c0);
        goto LAB_007a0730;
      }
      __return_storage_ptr___00 = (Flow *)&conditionFlow.breakTo.super_IString.str._M_str;
    }
    Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_c0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&conditionFlow.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitBreak(Break* curr) {
    NOTE_ENTER("Break");
    bool condition = true;
    Flow flow;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
    }
    if (curr->condition) {
      Flow conditionFlow = visit(curr->condition);
      if (conditionFlow.breaking()) {
        return conditionFlow;
      }
      condition = conditionFlow.getSingleValue().getInteger() != 0;
      if (!condition) {
        return flow;
      }
    }
    flow.breakTo = curr->name;
    return flow;
  }